

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

SSTableIndex * __thiscall SSTable::getIndex(SSTable *this)

{
  bool bVar1;
  SSTableHeader *pSVar2;
  vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_00;
  istream *piVar3;
  undefined1 local_250 [8];
  SSTableIndexItem temp;
  fpos<__mbstate_t> local_230;
  undefined1 local_220 [8];
  ifstream in;
  SSTableHeader *h;
  SSTable *this_local;
  
  if (this->index == (SSTableIndex *)0x0) {
    pSVar2 = getHeader(this);
    create_binary_ifstream((path *)local_220);
    std::fpos<__mbstate_t>::fpos(&local_230,pSVar2->index_offset);
    std::istream::seekg(local_220,local_230._M_off,local_230._M_state);
    this_00 = (vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)operator_new(0x18);
    memset(this_00,0,0x18);
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::vector(this_00);
    this->index = this_00;
    memset(local_250,0,0x10);
    while( true ) {
      piVar3 = operator>>((istream *)local_220,(SSTableIndexItem *)local_250);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::push_back
                (this->index,(value_type *)local_250);
    }
    std::ifstream::~ifstream(local_220);
  }
  return this->index;
}

Assistant:

SSTableIndex *SSTable::getIndex() {
    if (index == nullptr) {
        auto *h = getHeader();
        auto in = create_binary_ifstream(file);
        in.seekg(h->index_offset);
        index = new SSTableIndex{};
        auto temp = SSTableIndexItem{};
        while (in >> temp) {
            index->push_back(temp);
        }
    }
    return index;
}